

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

int shallow_dump(nvamemtiming_conf *conf)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  FILE *__stream;
  int iVar3;
  uint8_t orig;
  FILE *outf;
  char local_38 [4];
  int i;
  char filename [21];
  nvamemtiming_conf *conf_local;
  
  if (((conf->field_4).manual.index == 0xff) || ((conf->field_4).manual.value == 0xff)) {
    sprintf(local_38,"regs_timing_%i_%i",(ulong)(conf->field_4).manual.index,
            (ulong)(conf->field_4).manual.value);
  }
  else {
    sprintf(local_38,"regs_timing");
  }
  __stream = fopen(local_38,"wb");
  if (__stream == (FILE *)0x0) {
    perror("Open regs_timing");
    conf_local._4_4_ = 1;
  }
  else {
    if ((nva_cards[conf->cnum]->chipset).card_type < 0xc0) {
      timing_value_types = nv40_timing_value_types;
    }
    else {
      timing_value_types = nvc0_timing_value_types;
    }
    if ((conf->field_4).manual.index == 0xff) {
      (conf->field_4).manual.index = '\0';
    }
    if ((conf->field_4).manual.value == 0xff) {
      (conf->field_4).manual.value = (char)(conf->vbios).timing_entry_length + 0xff;
    }
    fprintf(_stderr,"Shallow mode: Will iterate between %i and %i\n",
            (ulong)(conf->field_4).manual.index);
    launch(conf,(FILE *)__stream,'\0',NO_COLOR);
    for (outf._4_4_ = (uint)(conf->field_4).manual.index;
        (int)outf._4_4_ <= (int)(uint)(conf->field_4).manual.value; outf._4_4_ = outf._4_4_ + 1) {
      uVar1 = (conf->vbios).data[(int)((conf->vbios).timing_entry_offset + outf._4_4_)];
      if ((timing_value_types[(int)outf._4_4_] == VALUE) ||
         ((timing_value_types[(int)outf._4_4_] == EMPTY && (uVar1 != '\0')))) {
        if ((timing_value_types[(int)outf._4_4_] == EMPTY) && (uVar1 != '\0')) {
          fprintf(__stream,"WARNING: The following entry was supposed to be unused!\n");
        }
        puVar2 = (conf->vbios).data;
        iVar3 = (conf->vbios).timing_entry_offset + outf._4_4_;
        puVar2[iVar3] = puVar2[iVar3] + '\x01';
        launch(conf,(FILE *)__stream,(uint8_t)outf._4_4_ + '\x01',COLOR);
      }
      else if (timing_value_types[(int)outf._4_4_] == BITFIELD) {
        iterate_bitfield(conf,(FILE *)__stream,(uint8_t)outf._4_4_,COLOR);
      }
      else if (timing_value_types[(int)outf._4_4_] == EMPTY) {
        fprintf(__stream,"timing entry [%u/%u] is supposed empty\n\n",(ulong)(outf._4_4_ + 1),
                (ulong)(conf->vbios).timing_entry_length);
      }
      (conf->vbios).data[(int)((conf->vbios).timing_entry_offset + outf._4_4_)] = uVar1;
    }
    fclose(__stream);
    conf_local._4_4_ = 0;
  }
  return conf_local._4_4_;
}

Assistant:

int
shallow_dump(struct nvamemtiming_conf *conf)
{
	char filename[21];
	int i;

	if (conf->range.start == (unsigned char) -1 ||  conf->range.end == (unsigned char) -1)
		sprintf(filename, "regs_timing_%i_%i", conf->range.start, conf->range.end);
	else
		sprintf(filename, "regs_timing");

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(filename, "wb");
	if (!outf) {
		perror("Open regs_timing");
		return 1;
	}

	if (nva_cards[conf->cnum]->chipset.card_type >= 0xc0)
		timing_value_types = nvc0_timing_value_types;
	else
		timing_value_types = nv40_timing_value_types;

	if (conf->range.start == (unsigned char) -1)
		conf->range.start = 0;
	if (conf->range.end == (unsigned char) -1)
		conf->range.end = conf->vbios.timing_entry_length - 1;

	fprintf(stderr, "Shallow mode: Will iterate between %i and %i\n", conf->range.start, conf->range.end);

	launch(conf, outf, 0, NO_COLOR);

	/* iterate through the vbios timing values */
	for (i = conf->range.start; i <= conf->range.end; i++) {
		uint8_t orig = conf->vbios.data[conf->vbios.timing_entry_offset + i];

		if (timing_value_types[i] == VALUE ||
			(timing_value_types[i] == EMPTY && orig > 0))
		{
			if (timing_value_types[i] == EMPTY && orig > 0)
				fprintf(outf, "WARNING: The following entry was supposed to be unused!\n");

			conf->vbios.data[conf->vbios.timing_entry_offset + i]++;
			launch(conf, outf, i + 1, COLOR);
		} else if (timing_value_types[i] == BITFIELD) {
			iterate_bitfield(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == EMPTY) {
			fprintf(outf, "timing entry [%u/%u] is supposed empty\n\n",
				i + 1, conf->vbios.timing_entry_length);
		}

		conf->vbios.data[conf->vbios.timing_entry_offset + i] = orig;
	}

	fclose(outf);

	return 0;
}